

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_kd_tree_encoder.cc
# Opt level: O2

bool __thiscall
draco::PointCloudKdTreeEncoder::GenerateAttributesEncoder
          (PointCloudKdTreeEncoder *this,int32_t att_id)

{
  pointer puVar1;
  tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_> this_00;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> local_20
  ;
  
  puVar1 = (this->super_PointCloudEncoder).attributes_encoders_.
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->super_PointCloudEncoder).attributes_encoders_.
                          super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3) == 0) {
    this_00.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          )operator_new(0x98);
    KdTreeAttributesEncoder::KdTreeAttributesEncoder
              ((KdTreeAttributesEncoder *)
               this_00.
               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,att_id);
    local_20._M_t.
    super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
    .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         (tuple<draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>)
         this_00.
         super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
         .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
    PointCloudEncoder::AddAttributesEncoder
              (&this->super_PointCloudEncoder,
               (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)&local_20);
    if ((_Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
         )local_20._M_t.
          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl !=
        (AttributesEncoder *)0x0) {
      (**(code **)(*(long *)local_20._M_t.
                            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl +
                  8))();
    }
  }
  else {
    AttributesEncoder::AddAttributeId
              ((AttributesEncoder *)
               (puVar1->_M_t).
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t,att_id);
  }
  return true;
}

Assistant:

bool PointCloudKdTreeEncoder::GenerateAttributesEncoder(int32_t att_id) {
  if (num_attributes_encoders() == 0) {
    // Create a new attribute encoder only for the first attribute.
    AddAttributesEncoder(std::unique_ptr<AttributesEncoder>(
        new KdTreeAttributesEncoder(att_id)));
    return true;
  }
  // Add a new attribute to the attribute encoder.
  attributes_encoder(0)->AddAttributeId(att_id);
  return true;
}